

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O0

ssize_t __thiscall
brynet::net::DataSocket::send(DataSocket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  element_type *this_00;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  anon_class_56_3_a00daafe local_b8;
  USER_PROC local_80;
  undefined1 local_50 [8];
  PACKED_SENDED_CALLBACK callbackCapture;
  PACKET_PTR packetCapture;
  PACKED_SENDED_CALLBACK *callback_local;
  PACKET_PTR *packet_local;
  DataSocket *this_local;
  
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&callbackCapture._M_invoker,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_register_00000034,__fd));
  std::function<void_()>::function((function<void_()> *)local_50,(function<void_()> *)__buf);
  this_00 = std::
            __shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->mEventLoop);
  local_b8.this = this;
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::shared_ptr(&local_b8.packetCapture,
               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&callbackCapture._M_invoker);
  std::function<void_()>::function(&local_b8.callbackCapture,(function<void_()> *)local_50);
  std::function<void()>::
  function<brynet::net::DataSocket::send(std::shared_ptr<std::__cxx11::string>const&,std::function<void()>const&)::__0,void>
            ((function<void()> *)&local_80,&local_b8);
  EventLoop::pushAsyncProc(this_00,&local_80);
  std::function<void_()>::~function(&local_80);
  send(std::shared_ptr<std::__cxx11::string>const&,std::function<void()>const&)::$_0::~__0
            ((__0 *)&local_b8);
  std::function<void_()>::~function((function<void_()> *)local_50);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&callbackCapture._M_invoker);
  return extraout_RAX;
}

Assistant:

void DataSocket::send(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    auto packetCapture = packet;
    auto callbackCapture = callback;
    mEventLoop->pushAsyncProc([this, packetCapture, callbackCapture](){
        auto len = packetCapture->size();
        mSendList.push_back({ std::move(packetCapture), len, std::move(callbackCapture) });
        runAfterFlush();
    });
}